

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_file.c
# Opt level: O2

ion_err_t ion_fremove(char *name)

{
  ion_err_t iVar1;
  int iVar2;
  
  iVar2 = remove(name);
  iVar1 = (ion_err_t)iVar2;
  if (iVar2 != 0) {
    iVar1 = '\v';
  }
  return iVar1;
}

Assistant:

ion_err_t
ion_fremove(
	char *name
) {
	int status;

	status = fremove(name);

	if (0 == status) {
		return err_ok;
	}
	else {
		return err_file_delete_error;
	}
}